

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_avx2.c
# Opt level: O1

_Bool aom_compute_mean_stddev_avx2
                (uchar *frame,int stride,int x,int y,double *mean,double *one_over_stddev)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*pauVar5) [16];
  int iVar6;
  double dVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  
  pauVar5 = (undefined1 (*) [16])(frame + (x + (y + -7) * stride + -7));
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 0x10;
  do {
    auVar4 = vpmovzxbw_avx2(*pauVar5);
    auVar3 = vpaddw_avx2(auVar9._0_32_,auVar4);
    auVar9 = ZEXT3264(auVar3);
    auVar4 = vpmaddwd_avx2(auVar4,auVar4);
    auVar4 = vpaddd_avx2(auVar4,auVar8._0_32_);
    auVar8 = ZEXT3264(auVar4);
    pauVar5 = (undefined1 (*) [16])(*pauVar5 + stride);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  auVar11._8_2_ = 1;
  auVar11._0_8_ = 0x1000100010001;
  auVar11._10_2_ = 1;
  auVar11._12_2_ = 1;
  auVar11._14_2_ = 1;
  auVar11._16_2_ = 1;
  auVar11._18_2_ = 1;
  auVar11._20_2_ = 1;
  auVar11._22_2_ = 1;
  auVar11._24_2_ = 1;
  auVar11._26_2_ = 1;
  auVar11._28_2_ = 1;
  auVar11._30_2_ = 1;
  auVar3 = vpmaddwd_avx2(auVar3,auVar11);
  auVar3 = vphaddd_avx2(auVar3,auVar4);
  auVar10 = vpaddd_avx(auVar3._0_16_,auVar3._16_16_);
  auVar2 = vphaddd_avx(auVar10,auVar10);
  auVar10 = vcvtdq2pd_avx(auVar2);
  dVar1 = auVar10._0_8_ * 0.0625;
  *mean = dVar1;
  auVar10 = vpshufd_avx(auVar2,0xff);
  auVar10 = vcvtdq2pd_avx(auVar10);
  dVar1 = auVar10._0_8_ - dVar1 * dVar1;
  dVar7 = 0.0;
  if (256.0 <= dVar1) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    if (dVar1 < 0.0) {
      dVar7 = sqrt(dVar1);
    }
    else {
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      dVar7 = auVar10._0_8_;
    }
    dVar7 = 1.0 / dVar7;
  }
  *one_over_stddev = dVar7;
  return 256.0 <= dVar1;
}

Assistant:

bool aom_compute_mean_stddev_avx2(const unsigned char *frame, int stride, int x,
                                  int y, double *mean,
                                  double *one_over_stddev) {
  __m256i sum_vec = _mm256_setzero_si256();
  __m256i sumsq_vec = _mm256_setzero_si256();

  frame += (y - MATCH_SZ_BY2) * stride + (x - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m256i v = _mm256_cvtepu8_epi16(_mm_loadu_si128((__m128i *)frame));

    sum_vec = _mm256_add_epi16(sum_vec, v);
    sumsq_vec = _mm256_add_epi32(sumsq_vec, _mm256_madd_epi16(v, v));

    frame += stride;
  }

  // Reduce sum_vec and sumsq_vec into single values
  // Start by reducing each vector to 8x32-bit values, hadd() to perform 8
  // additions, sum vertically to do 4 more, then the last 2 in scalar code.
  const __m256i ones = _mm256_load_si256((__m256i *)ones_array);
  const __m256i partial_sum = _mm256_madd_epi16(sum_vec, ones);
  const __m256i tmp_8x32 = _mm256_hadd_epi32(partial_sum, sumsq_vec);
  const __m128i tmp_4x32 = _mm_add_epi32(_mm256_extracti128_si256(tmp_8x32, 0),
                                         _mm256_extracti128_si256(tmp_8x32, 1));
  const int sum =
      _mm_extract_epi32(tmp_4x32, 0) + _mm_extract_epi32(tmp_4x32, 1);
  const int sumsq =
      _mm_extract_epi32(tmp_4x32, 2) + _mm_extract_epi32(tmp_4x32, 3);

  *mean = (double)sum / MATCH_SZ;
  const double variance = sumsq - (*mean) * (*mean);
  if (variance < MIN_FEATURE_VARIANCE) {
    *one_over_stddev = 0.0;
    return false;
  }
  *one_over_stddev = 1.0 / sqrt(variance);
  return true;
}